

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

target_ulong helper_clcs_ppc64(CPUPPCState_conflict2 *env,uint32_t arg)

{
  int local_30;
  int local_2c;
  uint32_t arg_local;
  CPUPPCState_conflict2 *env_local;
  
  switch(arg) {
  case 0xc:
    env_local = (CPUPPCState_conflict2 *)(long)env->icache_line_size;
    break;
  case 0xd:
    env_local = (CPUPPCState_conflict2 *)(long)env->dcache_line_size;
    break;
  case 0xe:
    if (env->icache_line_size < env->dcache_line_size) {
      local_2c = env->icache_line_size;
    }
    else {
      local_2c = env->dcache_line_size;
    }
    env_local = (CPUPPCState_conflict2 *)(long)local_2c;
    break;
  case 0xf:
    if (env->dcache_line_size < env->icache_line_size) {
      local_30 = env->icache_line_size;
    }
    else {
      local_30 = env->dcache_line_size;
    }
    env_local = (CPUPPCState_conflict2 *)(long)local_30;
    break;
  default:
    env_local = (CPUPPCState_conflict2 *)0x0;
  }
  return (target_ulong)env_local;
}

Assistant:

target_ulong helper_clcs(CPUPPCState *env, uint32_t arg)
{
    switch (arg) {
    case 0x0CUL:
        /* Instruction cache line size */
        return env->icache_line_size;
        break;
    case 0x0DUL:
        /* Data cache line size */
        return env->dcache_line_size;
        break;
    case 0x0EUL:
        /* Minimum cache line size */
        return (env->icache_line_size < env->dcache_line_size) ?
            env->icache_line_size : env->dcache_line_size;
        break;
    case 0x0FUL:
        /* Maximum cache line size */
        return (env->icache_line_size > env->dcache_line_size) ?
            env->icache_line_size : env->dcache_line_size;
        break;
    default:
        /* Undefined */
        return 0;
        break;
    }
}